

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_file.cpp
# Opt level: O1

void __thiscall
ApiLayerManifestFile::ApiLayerManifestFile
          (ApiLayerManifestFile *this,ManifestFileType type,string *filename,string *layer_name,
          string *description,JsonVersion *api_version,uint32_t *implementation_version,
          string *library_path)

{
  pointer pcVar1;
  uint32_t uVar2;
  
  ManifestFile::ManifestFile(&this->super_ManifestFile,type,filename,library_path);
  (this->_api_version).patch = api_version->patch;
  uVar2 = api_version->minor;
  (this->_api_version).major = api_version->major;
  (this->_api_version).minor = uVar2;
  (this->_layer_name)._M_dataplus._M_p = (pointer)&(this->_layer_name).field_2;
  pcVar1 = (layer_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_layer_name,pcVar1,pcVar1 + layer_name->_M_string_length);
  (this->_description)._M_dataplus._M_p = (pointer)&(this->_description).field_2;
  pcVar1 = (description->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_description,pcVar1,pcVar1 + description->_M_string_length);
  this->_implementation_version = *implementation_version;
  return;
}

Assistant:

ApiLayerManifestFile::ApiLayerManifestFile(ManifestFileType type, const std::string &filename, const std::string &layer_name,
                                           const std::string &description, const JsonVersion &api_version,
                                           const uint32_t &implementation_version, const std::string &library_path)
    : ManifestFile(type, filename, library_path),
      _api_version(api_version),
      _layer_name(layer_name),
      _description(description),
      _implementation_version(implementation_version) {}